

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int mg_vprintf(mg_connection *nc,char *fmt,__va_list_tag *ap)

{
  char *__ptr;
  int len;
  char *buf;
  char mem [100];
  
  buf = mem;
  len = mg_avprintf(&buf,100,fmt,ap);
  __ptr = buf;
  if (0 < len) {
    mg_send(nc,buf,len);
  }
  if (__ptr != (char *)0x0 && __ptr != mem) {
    free(__ptr);
  }
  return len;
}

Assistant:

int mg_vprintf(struct mg_connection *nc, const char *fmt, va_list ap) {
    char mem[MG_VPRINTF_BUFFER_SIZE], *buf = mem;
    int len;

    if ((len = mg_avprintf(&buf, sizeof(mem), fmt, ap)) > 0) {
        mg_send(nc, buf, len);
    }
    if (buf != mem && buf != NULL) {
        MG_FREE(buf); /* LCOV_EXCL_LINE */
    }               /* LCOV_EXCL_LINE */

    return len;
}